

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderTessellationInputPatchDiscard::initTest
          (TessellationShaderTessellationInputPatchDiscard *this)

{
  pointer *pp_Var1;
  iterator __position;
  GLuint *pGVar2;
  int iVar3;
  GLenum GVar4;
  GLuint GVar5;
  undefined4 extraout_var;
  TessellationShaderUtils *this_00;
  NotSupportedError *this_01;
  long lVar6;
  char *vs_body;
  char *fs_body;
  string local_78;
  GLuint *local_50;
  undefined8 local_48;
  char *local_40;
  char *local_38;
  Functions *gl;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported != false) {
    iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    gl = (Functions *)CONCAT44(extraout_var,iVar3);
    this_00 = (TessellationShaderUtils *)operator_new(0x20);
    TessellationShaderUtils::TessellationShaderUtils(this_00,gl,&this->super_TestCaseBase);
    this->m_utils_ptr = this_00;
    (*gl->genVertexArrays)(1,&this->m_vao_id);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"Could not generate vertex array object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x1cb);
    (*gl->bindVertexArray)(this->m_vao_id);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"Error binding vertex array object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x1ce);
    local_50 = &this->m_bo_id;
    (*gl->genBuffers)(1,local_50);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glGenBuffers() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x1d1);
    GVar5 = (*gl->createShader)(0x8b30);
    this->m_fs_id = GVar5;
    GVar5 = (*gl->createShader)(0x8b31);
    this->m_vs_id = GVar5;
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glCreateShader() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x1d5);
    local_38 = "${VERSION}\n\nvoid main()\n{\n}\n";
    TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_fs_id,1,&local_38);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glShaderSource() failed for fragment shader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x1df);
    local_40 = "${VERSION}\n\nvoid main()\n{\n    gl_Position = vec4(1.0, 0.0, 0.0, 1.0);\n}\n";
    TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_vs_id,1,&local_40);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glShaderSource() failed for vertex shader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x1ea);
    local_48._0_4_ = this->m_fs_id;
    local_48._4_4_ = this->m_vs_id;
    TessellationShaderUtils::compileShaders(this->m_utils_ptr,2,(GLuint *)&local_48,true);
    lVar6 = 0;
    do {
      local_78._M_dataplus._M_p = (pointer)0x300000000;
      local_78._M_string_length = 0;
      initRun(this,(_run *)&local_78,*(_tessellation_primitive_mode *)((long)&DAT_01b67790 + lVar6))
      ;
      __position._M_current =
           (this->m_runs).
           super__Vector_base<glcts::TessellationShaderTessellationInputPatchDiscard::_run,_std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_runs).
          super__Vector_base<glcts::TessellationShaderTessellationInputPatchDiscard::_run,_std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<glcts::TessellationShaderTessellationInputPatchDiscard::_run,std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>>
        ::_M_realloc_insert<glcts::TessellationShaderTessellationInputPatchDiscard::_run_const&>
                  ((vector<glcts::TessellationShaderTessellationInputPatchDiscard::_run,std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>>
                    *)&this->m_runs,__position,(_run *)&local_78);
      }
      else {
        *(pointer *)__position._M_current = local_78._M_dataplus._M_p;
        (__position._M_current)->tc_id = (undefined4)local_78._M_string_length;
        (__position._M_current)->te_id = local_78._M_string_length._4_4_;
        pp_Var1 = &(this->m_runs).
                   super__Vector_base<glcts::TessellationShaderTessellationInputPatchDiscard::_run,_std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pp_Var1 = *pp_Var1 + 1;
      }
      pGVar2 = local_50;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0xc);
    (*gl->bindBuffer)(0x8c8e,*local_50);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glBindBuffer() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x208);
    (*gl->bindBufferBase)(0x8c8e,0,*pGVar2);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glBindBufferBase() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x20b);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"Tessellation shader functionality not supported, skipping","");
  tcu::NotSupportedError::NotSupportedError(this_01,&local_78);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderTessellationInputPatchDiscard::initTest()
{
	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Generate all test-wide objects needed for test execution */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	m_utils_ptr				 = new TessellationShaderUtils(gl, this);

	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed");

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() failed");

	/* Configure fragment shader body */
	const char* fs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "}\n";

	shaderSourceSpecialized(m_fs_id, 1 /* count */, &fs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for fragment shader");

	/* Configure vertex shader body */
	const char* vs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = vec4(1.0, 0.0, 0.0, 1.0);\n"
						  "}\n";

	shaderSourceSpecialized(m_vs_id, 1 /* count */, &vs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for vertex shader");

	/* Compile all the shaders */
	const glw::GLuint  shaders[] = { m_fs_id, m_vs_id };
	const unsigned int n_shaders = sizeof(shaders) / sizeof(shaders[0]);

	m_utils_ptr->compileShaders(n_shaders, shaders, true);

	/* Initialize all the runs. */
	const _tessellation_primitive_mode primitive_modes[] = { TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES };
	const unsigned int n_primitive_modes = sizeof(primitive_modes) / sizeof(primitive_modes[0]);

	for (unsigned int n_primitive_mode = 0; n_primitive_mode < n_primitive_modes; ++n_primitive_mode)
	{
		/* Initialize the run */
		_tessellation_primitive_mode primitive_mode = primitive_modes[n_primitive_mode];
		_run						 run;

		initRun(run, primitive_mode);

		/* Store the run */
		m_runs.push_back(run);
	} /* for (all primitive modes) */

	/* Set up buffer object bindings. Storage size will be determined on
	 * a per-iteration basis.
	 **/
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed");
}